

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QDockAreaLayoutItem>>
          (QtPrivate *this,QDebug debug,char *which,QList<QDockAreaLayoutItem> *c)

{
  Representation *pRVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  QDebug *pQVar5;
  QDockAreaLayoutItem *pQVar6;
  QDockAreaLayoutItem *item;
  QDebug dbg;
  QDockAreaLayoutItem *pQVar7;
  long in_FS_OFFSET;
  undefined1 local_60 [16];
  QPlaceHolderItem *local_50;
  Stream local_48 [8];
  QDebugStateSaver saver;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = (QPlaceHolderItem *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar5 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar5,'(');
  pQVar7 = (c->d).ptr;
  lVar3 = (c->d).size;
  pQVar6 = pQVar7 + lVar3;
  if (lVar3 == 0) goto LAB_003d14ec;
  local_50 = *(QPlaceHolderItem **)debug.stream;
  item = (QDockAreaLayoutItem *)&local_50;
  pRVar1 = &(local_50->topLevelRect).y2;
  pRVar1->m_i = pRVar1->m_i + 1;
  dbg.stream = local_48;
  while( true ) {
    ::operator<<(dbg,item);
    QDebug::~QDebug((QDebug *)dbg.stream);
    QDebug::~QDebug((QDebug *)item);
    pQVar7 = pQVar7 + 1;
LAB_003d14ec:
    if (pQVar7 == pQVar6) break;
    pQVar5 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60._0_8_ = pQVar5->stream;
    item = (QDockAreaLayoutItem *)local_60;
    (((QLayoutItem *)(local_60._0_8_ + 0x20))->align).
    super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (((QLayoutItem *)(local_60._0_8_ + 0x20))->align).
         super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i +
         1;
    dbg.stream = (Stream *)(local_60 + 8);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}